

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidCrop3(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ArrayFeatureType_ShapeRange *pAVar3;
  ostream *poVar4;
  Result local_d0;
  CropLayerParams *params;
  NeuralNetworkLayer *cropLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape2;
  FeatureDescription *topIn2;
  SizeRange *widthRange;
  SizeRange *heightRange;
  SizeRange *chanShape;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  chanShape = (SizeRange *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pAVar3 = CoreML::Specification::ArrayFeatureType::mutable_shaperange
                     ((ArrayFeatureType *)chanShape);
  heightRange = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar3);
  CoreML::Specification::SizeRange::set_lowerbound(heightRange,6);
  CoreML::Specification::SizeRange::set_upperbound(heightRange,6);
  pAVar3 = CoreML::Specification::ArrayFeatureType::mutable_shaperange
                     ((ArrayFeatureType *)chanShape);
  widthRange = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar3);
  CoreML::Specification::SizeRange::set_lowerbound(widthRange,100);
  CoreML::Specification::SizeRange::set_upperbound(widthRange,1000);
  pAVar3 = CoreML::Specification::ArrayFeatureType::mutable_shaperange
                     ((ArrayFeatureType *)chanShape);
  topIn2 = (FeatureDescription *)
           CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar3);
  CoreML::Specification::SizeRange::set_lowerbound((SizeRange *)topIn2,5);
  CoreML::Specification::SizeRange::set_upperbound((SizeRange *)topIn2,0xf);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)chanShape,0xea);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)chanShape,0x14c);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  shape2 = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)shape2,"input2");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)shape2);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,10);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,0xb);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  cropLayer = (NeuralNetworkLayer *)
              CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  params = (CropLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)cropLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  local_d0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_crop((NeuralNetworkLayer *)params);
  CoreML::Specification::CropLayerParams::add_offset
            ((CropLayerParams *)local_d0.m_message._M_storage._M_storage,1);
  CoreML::Specification::CropLayerParams::add_offset
            ((CropLayerParams *)local_d0.m_message._M_storage._M_storage,2);
  CoreML::validate<(MLModelType)500>(&local_d0,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_d0);
  if (m1._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xeef);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_d0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidCrop3() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *chanShape = shape->mutable_shaperange()->add_sizeranges();
    chanShape->set_lowerbound(6);
    chanShape->set_upperbound(6);
    auto *heightRange = shape->mutable_shaperange()->add_sizeranges();
    heightRange->set_lowerbound(100);
    heightRange->set_upperbound(1000);
    auto *widthRange = shape->mutable_shaperange()->add_sizeranges();
    widthRange->set_lowerbound(5);
    widthRange->set_upperbound(15);


    shape->add_shape(234);
    shape->add_shape(332);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);
    shape2->add_shape(10);
    shape2->add_shape(11);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);
    params->add_offset(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}